

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int udp_listener_init(void *arg,nng_url *url,nni_listener *nlistener)

{
  int iVar1;
  nni_sock *sock;
  
  sock = nni_listener_sock(nlistener);
  *(nni_listener **)((long)arg + 0x3f0) = nlistener;
  iVar1 = udp_ep_init((udp_ep *)arg,url,sock,(nni_dialer *)0x0,nlistener);
  if (iVar1 == 0) {
    iVar1 = udp_check_url(url,true);
    if (iVar1 == 0) {
      iVar1 = nni_url_to_address((nng_sockaddr *)((long)arg + 0x858),url);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

static int
udp_listener_init(void *arg, nng_url *url, nni_listener *nlistener)
{
	udp_ep   *ep = arg;
	int       rv;
	nni_sock *sock = nni_listener_sock(nlistener);

	ep->nlistener = nlistener;
	if ((rv = udp_ep_init(ep, url, sock, NULL, nlistener)) != 0) {
		return (rv);
	}
	// Check for invalid URL components.
	if (((rv = udp_check_url(url, true)) != 0) ||
	    ((rv = nni_url_to_address(&ep->self_sa, url)) != 0)) {
		return (rv);
	}

	return (0);
}